

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O3

void __thiscall SGP4::Reset(SGP4 *this)

{
  this->use_simple_model_ = false;
  this->use_deep_space_ = false;
  memset(this,0,0x268);
  return;
}

Assistant:

void SGP4::Reset()
{
    use_simple_model_ = false;
    use_deep_space_ = false;

    std::memset(&common_consts_, 0, sizeof(common_consts_));
    std::memset(&nearspace_consts_, 0, sizeof(nearspace_consts_));
    std::memset(&deepspace_consts_, 0, sizeof(deepspace_consts_));
    std::memset(&integrator_params_, 0, sizeof(integrator_params_));
}